

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

ResolvedDecl * __thiscall
capnp::compiler::Compiler::Node::resolveId
          (ResolvedDecl *__return_storage_ptr__,Node *this,uint64_t id)

{
  _func_int *p_Var1;
  Fault local_30;
  LazyLoadCallback local_28;
  AnnotationFlag AStack_20;
  undefined4 uStack_1c;
  
  Impl::findNode((Impl *)&stack0xffffffffffffffd8,(uint64_t)this->module->compiler);
  if ((Resolver *)local_28._vptr_LazyLoadCallback != (Resolver *)0x0) {
    if (((Resolver *)(local_28._vptr_LazyLoadCallback + 2))->_vptr_Resolver == (_func_int **)0x0) {
      p_Var1 = (_func_int *)0x0;
    }
    else {
      p_Var1 = ((Resolver *)(local_28._vptr_LazyLoadCallback + 2))->_vptr_Resolver[9];
    }
    __return_storage_ptr__->id =
         (uint64_t)((Resolver *)(local_28._vptr_LazyLoadCallback + 9))->_vptr_Resolver;
    __return_storage_ptr__->genericParamCount =
         *(uint *)((long)local_28._vptr_LazyLoadCallback + 100);
    __return_storage_ptr__->scopeId = (uint64_t)p_Var1;
    __return_storage_ptr__->kind =
         *(Which *)&((Resolver *)(local_28._vptr_LazyLoadCallback + 0xc))->_vptr_Resolver;
    __return_storage_ptr__->resolver = (Resolver *)local_28._vptr_LazyLoadCallback;
    (__return_storage_ptr__->brand).ptr.isSet = false;
    return __return_storage_ptr__;
  }
  local_30.exception = (Exception *)0x0;
  local_28._vptr_LazyLoadCallback = (_func_int **)0x0;
  AStack_20 = COMPILE_ANNOTATIONS;
  uStack_1c = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

Resolver::ResolvedDecl Compiler::Node::resolveId(uint64_t id) {
  auto& n = KJ_ASSERT_NONNULL(module->getCompiler().findNode(id));
  uint64_t parentId = n.parent.map([](Node& n) { return n.id; }).orDefault(0);
  return { n.id, n.genericParamCount, parentId, n.kind, &n, kj::none };
}